

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O1

vw * parse_args(options_i *options,trace_message_t trace_listener,void *trace_context)

{
  _func_int **pp_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  vw *this;
  typed_option<unsigned_long> *ptVar8;
  parser *this_00;
  option_group_definition *poVar9;
  AllReduceSockets *this_01;
  vw_exception *this_02;
  byte bVar10;
  byte bVar11;
  option_group_definition weight_args;
  size_t total_arg;
  size_t unique_id_arg;
  size_t ring_size;
  size_t node_arg;
  option_group_definition update_args;
  option_group_definition vw_args;
  string span_server_arg;
  option_group_definition parallelization_args;
  stringstream __msg;
  undefined1 *local_14a8 [2];
  undefined1 local_1498 [16];
  undefined1 *local_1488 [2];
  undefined1 local_1478 [16];
  undefined1 *local_1468 [2];
  undefined1 local_1458 [16];
  option_group_definition local_1448;
  undefined1 *local_1410 [2];
  undefined1 local_1400 [16];
  undefined1 *local_13f0 [2];
  undefined1 local_13e0 [16];
  size_t local_13d0;
  string local_13c8;
  string local_13a8;
  undefined1 *local_1388 [2];
  undefined1 local_1378 [16];
  undefined1 *local_1368 [2];
  undefined1 local_1358 [16];
  string local_1348;
  string local_1328;
  string local_1308;
  string local_12e8;
  string local_12c8;
  undefined1 local_12a8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1220;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1210;
  string local_1208;
  undefined1 *local_11e8;
  long local_11e0;
  undefined1 local_11d8 [16];
  undefined1 *local_11c8;
  long local_11c0;
  undefined1 local_11b8 [16];
  undefined1 *local_11a8;
  long local_11a0;
  undefined1 local_1198 [16];
  undefined1 *local_1188;
  long local_1180;
  undefined1 local_1178 [16];
  undefined1 local_1168 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10d0;
  option_group_definition local_10c8;
  option_group_definition local_1090;
  undefined1 local_1058 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_fd0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_fc0;
  undefined1 local_fb8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f20;
  undefined1 local_f18 [48];
  string local_ee8 [88];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e80;
  string local_e78;
  string local_e58;
  string local_e38;
  undefined1 *local_e18 [2];
  undefined1 local_e08 [16];
  string local_df8;
  string local_dd8;
  string local_db8;
  string local_d98;
  undefined1 local_d78 [40];
  pointer psStack_d50;
  _Alloc_hider local_d48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_cf0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ce0;
  string local_cd8;
  string local_cb8;
  string local_c98;
  undefined1 local_c78 [48];
  string local_c48 [32];
  string local_c28 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_bf0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_be0;
  string local_af0;
  typed_option<unsigned_long> local_ad0;
  typed_option<unsigned_long> local_a30;
  typed_option<unsigned_long> local_990;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8f0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_850;
  typed_option<bool> local_7b0;
  typed_option<bool> local_710;
  typed_option<bool> local_670;
  typed_option<bool> local_5d0;
  typed_option<float> local_530;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_490;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  typed_option<double> local_350;
  typed_option<float> local_2b0;
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<unsigned_long> local_d0;
  
  this = (vw *)operator_new(0x3658);
  vw::vw(this);
  this->options = options;
  if (trace_listener != (trace_message_t)0x0) {
    *(trace_message_t *)&(this->trace_message).super_ostream.field_0x80 = trace_listener;
    *(void **)&(this->trace_message).super_ostream.field_0x78 = trace_context;
  }
  time(&this->init_time);
  local_1188 = local_1178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1188,"VW options","");
  local_1090.m_name._M_dataplus._M_p = (pointer)&local_1090.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1090,local_1188,local_1188 + local_1180);
  local_1090.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1090.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1090.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1188 != local_1178) {
    operator_delete(local_1188);
  }
  local_c98._M_dataplus._M_p = (pointer)&local_c98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c98,"ring_size","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_c78,&local_c98,&local_13d0);
  ptVar8 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_c78,0x100);
  local_12a8._0_8_ = local_12a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_12a8,"size of example ring","");
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_d0,ptVar8);
  VW::config::option_group_definition::add<unsigned_long>(&local_1090,&local_d0);
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf5a0;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((undefined1 *)local_12a8._0_8_ != local_12a8 + 0x10) {
    operator_delete((void *)local_12a8._0_8_);
  }
  local_c78._0_8_ = &PTR__typed_option_002cf5a0;
  if (local_be0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_be0._M_pi);
  }
  if (local_bf0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_bf0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_c78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c98._M_dataplus._M_p != &local_c98.field_2) {
    operator_delete(local_c98._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_1090);
  this_00 = (parser *)operator_new(0x390);
  parser::parser(this_00,local_13d0);
  this->p = this_00;
  local_11a8 = local_1198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_11a8,"Update options","");
  local_10c8.m_name._M_dataplus._M_p = (pointer)&local_10c8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_10c8,local_11a8,local_11a8 + local_11a0);
  local_10c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_10c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_11a8 != local_1198) {
    operator_delete(local_11a8);
  }
  local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"learning_rate","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_c78,&local_1208,&this->eta);
  local_f18._0_8_ = local_f18 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f18,"Set learning rate","");
  std::__cxx11::string::_M_assign(local_c48);
  local_1168._0_8_ = local_1168 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1168,"l","");
  std::__cxx11::string::_M_assign(local_c28);
  VW::config::typed_option<float>::typed_option(&local_170,(typed_option<float> *)local_c78);
  poVar9 = VW::config::option_group_definition::add<float>(&local_10c8,&local_170);
  local_12c8._M_dataplus._M_p = (pointer)&local_12c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12c8,"power_t","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_12a8,&local_12c8,&this->power_t);
  local_1448.m_name._M_dataplus._M_p = (pointer)&local_1448.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1448,"t power value","");
  std::__cxx11::string::_M_assign((string *)(local_12a8 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_210,(typed_option<float> *)local_12a8);
  poVar9 = VW::config::option_group_definition::add<float>(poVar9,&local_210);
  local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb8,"decay_learning_rate","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_fb8,&local_cb8,&this->eta_decay_rate);
  local_14a8[0] = local_1498;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14a8,"Set Decay factor for learning_rate between passes","");
  std::__cxx11::string::_M_assign((string *)(local_fb8 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_2b0,(typed_option<float> *)local_fb8);
  poVar9 = VW::config::option_group_definition::add<float>(poVar9,&local_2b0);
  local_cd8._M_dataplus._M_p = (pointer)&local_cd8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cd8,"initial_t","");
  VW::config::typed_option<double>::typed_option
            ((typed_option<double> *)local_1058,&local_cd8,&this->sd->t);
  local_1468[0] = local_1458;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1468,"initial t value","");
  std::__cxx11::string::_M_assign((string *)(local_1058 + 0x30));
  VW::config::typed_option<double>::typed_option(&local_350,(typed_option<double> *)local_1058);
  poVar9 = VW::config::option_group_definition::add<double>(poVar9,&local_350);
  local_d98._M_dataplus._M_p = (pointer)&local_d98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d98,"feature_mask","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_d78,&local_d98,&this->feature_mask);
  local_1488[0] = local_1478;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1488,
             "Use existing regressor to determine which parameters may be updated.  If no initial_regressor given, also used for initial weights."
             ,"");
  std::__cxx11::string::_M_assign((string *)&local_d48);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_3f0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_d78);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar9,&local_3f0);
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf568;
  if (local_3f0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_3f0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_1488[0] != local_1478) {
    operator_delete(local_1488[0]);
  }
  local_d78._0_8_ = &PTR__typed_option_002cf568;
  if (local_ce0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ce0._M_pi);
  }
  if (local_cf0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_cf0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d98._M_dataplus._M_p != &local_d98.field_2) {
    operator_delete(local_d98._M_dataplus._M_p);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf680;
  if (local_350.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_1468[0] != local_1458) {
    operator_delete(local_1468[0]);
  }
  local_1058._0_8_ = &PTR__typed_option_002cf680;
  if (local_fc0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fc0._M_pi);
  }
  if (local_fd0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fd0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1058);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
    operator_delete(local_cd8._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf648;
  if (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_14a8[0] != local_1498) {
    operator_delete(local_14a8[0]);
  }
  local_fb8._0_8_ = &PTR__typed_option_002cf648;
  if (local_f20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f20._M_pi);
  }
  if (local_f30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f30._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_fb8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
    operator_delete(local_cb8._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf648;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1448.m_name._M_dataplus._M_p != &local_1448.m_name.field_2) {
    operator_delete(local_1448.m_name._M_dataplus._M_p);
  }
  local_12a8._0_8_ = &PTR__typed_option_002cf648;
  if (local_1210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1210._M_pi);
  }
  if (local_1220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1220._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_12a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12c8._M_dataplus._M_p != &local_12c8.field_2) {
    operator_delete(local_12c8._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf648;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((undefined1 *)local_1168._0_8_ != local_1168 + 0x10) {
    operator_delete((void *)local_1168._0_8_);
  }
  if ((undefined1 *)local_f18._0_8_ != local_f18 + 0x10) {
    operator_delete((void *)local_f18._0_8_);
  }
  local_c78._0_8_ = &PTR__typed_option_002cf648;
  if (local_be0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_be0._M_pi);
  }
  if (local_bf0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_bf0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_c78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1208._M_dataplus._M_p != &local_1208.field_2) {
    operator_delete(local_1208._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_10c8);
  local_11c8 = local_11b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_11c8,"Weight options","");
  local_1448.m_name._M_dataplus._M_p = (pointer)&local_1448.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1448,local_11c8,local_11c8 + local_11c0);
  local_1448.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1448.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1448.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_11c8 != local_11b8) {
    operator_delete(local_11c8);
  }
  local_12e8._M_dataplus._M_p = (pointer)&local_12e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12e8,"initial_regressor","");
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_c78,&local_12e8,&this->initial_regressors);
  local_14a8[0] = local_1498;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14a8,"Initial regressor(s)","");
  std::__cxx11::string::_M_assign(local_c48);
  local_1468[0] = local_1458;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1468,"i","");
  std::__cxx11::string::_M_assign(local_c28);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_490,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_c78);
  poVar9 = VW::config::option_group_definition::
           add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (&local_1448,&local_490);
  local_1308._M_dataplus._M_p = (pointer)&local_1308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1308,"initial_weight","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_12a8,&local_1308,&this->initial_weight);
  local_1488[0] = local_1478;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1488,"Set all weights to an initial value of arg.","");
  std::__cxx11::string::_M_assign((string *)(local_12a8 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_530,(typed_option<float> *)local_12a8);
  poVar9 = VW::config::option_group_definition::add<float>(poVar9,&local_530);
  local_1328._M_dataplus._M_p = (pointer)&local_1328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1328,"random_weights","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_fb8,&local_1328,&this->random_weights);
  local_13f0[0] = local_13e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13f0,"make initial weights random","");
  std::__cxx11::string::_M_assign((string *)(local_fb8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_5d0,(typed_option<bool> *)local_fb8);
  poVar9 = VW::config::option_group_definition::add<bool>(poVar9,&local_5d0);
  local_1348._M_dataplus._M_p = (pointer)&local_1348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1348,"normal_weights","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1058,&local_1348,&this->normal_weights);
  local_1410[0] = local_1400;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1410,"make initial weights normal","");
  std::__cxx11::string::_M_assign((string *)(local_1058 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_670,(typed_option<bool> *)local_1058);
  poVar9 = VW::config::option_group_definition::add<bool>(poVar9,&local_670);
  local_db8._M_dataplus._M_p = (pointer)&local_db8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_db8,"truncated_normal_weights","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_d78,&local_db8,&this->tnormal_weights);
  local_1368[0] = local_1358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1368,"make initial weights truncated normal","");
  std::__cxx11::string::_M_assign((string *)&local_d48);
  VW::config::typed_option<bool>::typed_option(&local_710,(typed_option<bool> *)local_d78);
  poVar9 = VW::config::option_group_definition::add<bool>(poVar9,&local_710);
  local_dd8._M_dataplus._M_p = (pointer)&local_dd8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_dd8,"sparse_weights","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_f18,&local_dd8,&(this->weights).sparse);
  local_1388[0] = local_1378;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1388,"Use a sparse datastructure for weights","");
  std::__cxx11::string::_M_assign(local_ee8);
  VW::config::typed_option<bool>::typed_option(&local_7b0,(typed_option<bool> *)local_f18);
  poVar9 = VW::config::option_group_definition::add<bool>(poVar9,&local_7b0);
  local_df8._M_dataplus._M_p = (pointer)&local_df8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_df8,"input_feature_regularizer","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1168,&local_df8,&this->per_feature_regularizer_input);
  local_e18[0] = local_e08;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e18,"Per feature regularization input file","");
  std::__cxx11::string::_M_assign((string *)(local_1168 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_850,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1168);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar9,&local_850);
  local_850.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf568;
  if (local_850.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_850.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_850.super_base_option);
  if (local_e18[0] != local_e08) {
    operator_delete(local_e18[0]);
  }
  local_1168._0_8_ = &PTR__typed_option_002cf568;
  if (local_10d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10d0._M_pi);
  }
  if (local_10e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10e0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
    operator_delete(local_df8._M_dataplus._M_p);
  }
  local_7b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf500;
  if (local_7b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_7b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_7b0.super_base_option);
  if (local_1388[0] != local_1378) {
    operator_delete(local_1388[0]);
  }
  local_f18._0_8_ = &PTR__typed_option_002cf500;
  if (local_e80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e80._M_pi);
  }
  if (local_e90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e90._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_f18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
    operator_delete(local_dd8._M_dataplus._M_p);
  }
  local_710.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf500;
  if (local_710.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_710.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_710.super_base_option);
  if (local_1368[0] != local_1358) {
    operator_delete(local_1368[0]);
  }
  local_d78._0_8_ = &PTR__typed_option_002cf500;
  if (local_ce0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ce0._M_pi);
  }
  if (local_cf0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_cf0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_db8._M_dataplus._M_p != &local_db8.field_2) {
    operator_delete(local_db8._M_dataplus._M_p);
  }
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf500;
  if (local_670.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if (local_1410[0] != local_1400) {
    operator_delete(local_1410[0]);
  }
  local_1058._0_8_ = &PTR__typed_option_002cf500;
  if (local_fc0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fc0._M_pi);
  }
  if (local_fd0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fd0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1058);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1348._M_dataplus._M_p != &local_1348.field_2) {
    operator_delete(local_1348._M_dataplus._M_p);
  }
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf500;
  if (local_5d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if (local_13f0[0] != local_13e0) {
    operator_delete(local_13f0[0]);
  }
  local_fb8._0_8_ = &PTR__typed_option_002cf500;
  if (local_f20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f20._M_pi);
  }
  if (local_f30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f30._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_fb8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1328._M_dataplus._M_p != &local_1328.field_2) {
    operator_delete(local_1328._M_dataplus._M_p);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf648;
  if (local_530.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if (local_1488[0] != local_1478) {
    operator_delete(local_1488[0]);
  }
  local_12a8._0_8_ = &PTR__typed_option_002cf648;
  if (local_1210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1210._M_pi);
  }
  if (local_1220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1220._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_12a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1308._M_dataplus._M_p != &local_1308.field_2) {
    operator_delete(local_1308._M_dataplus._M_p);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf5d8;
  if (local_490.m_default_value.
      super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.
               super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_490.m_value.
      super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.
               super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if (local_1468[0] != local_1458) {
    operator_delete(local_1468[0]);
  }
  if (local_14a8[0] != local_1498) {
    operator_delete(local_14a8[0]);
  }
  local_c78._0_8_ = &PTR__typed_option_002cf5d8;
  if (local_be0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_be0._M_pi);
  }
  if (local_bf0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_bf0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_c78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12e8._M_dataplus._M_p != &local_12e8.field_2) {
    operator_delete(local_12e8._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_1448);
  local_f18._0_8_ = local_f18 + 0x10;
  local_f18._8_8_ = (pointer)0x0;
  local_f18[0x10] = '\0';
  local_11e8 = local_11d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_11e8,"Parallelization options","");
  local_d78._0_8_ = local_d78 + 0x10;
  std::__cxx11::string::_M_construct<char*>((string *)local_d78,local_11e8,local_11e8 + local_11e0);
  local_d78._32_8_ = 0;
  psStack_d50 = (pointer)0x0;
  local_d48._M_p = (pointer)0x0;
  if (local_11e8 != local_11d8) {
    operator_delete(local_11e8);
  }
  local_13a8._M_dataplus._M_p = (pointer)&local_13a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13a8,"span_server","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_c78,&local_13a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f18);
  local_1168._0_8_ = local_1168 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1168,"Location of server for setting up spanning tree","");
  std::__cxx11::string::_M_assign(local_c48);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_8f0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_c78);
  poVar9 = VW::config::option_group_definition::add<std::__cxx11::string>
                     ((option_group_definition *)local_d78,&local_8f0);
  local_13c8._M_dataplus._M_p = (pointer)&local_13c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13c8,"unique_id","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_12a8,&local_13c8,(unsigned_long *)local_13f0);
  ptVar8 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_12a8,0);
  local_14a8[0] = local_1498;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14a8,"unique id used for cluster parallel jobs","");
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_990,ptVar8);
  poVar9 = VW::config::option_group_definition::add<unsigned_long>(poVar9,&local_990);
  local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e38,"total","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_fb8,&local_e38,(unsigned_long *)local_1410);
  ptVar8 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_fb8,1);
  local_1468[0] = local_1458;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1468,"total number of nodes used in cluster parallel job","");
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_a30,ptVar8);
  poVar9 = VW::config::option_group_definition::add<unsigned_long>(poVar9,&local_a30);
  local_e58._M_dataplus._M_p = (pointer)&local_e58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e58,"node","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_1058,&local_e58,(unsigned_long *)local_1368);
  ptVar8 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_1058,0);
  local_1488[0] = local_1478;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1488,"node number in cluster parallel job","");
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_ad0,ptVar8);
  VW::config::option_group_definition::add<unsigned_long>(poVar9,&local_ad0);
  local_ad0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf5a0;
  if (local_ad0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ad0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_ad0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ad0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_ad0.super_base_option);
  if (local_1488[0] != local_1478) {
    operator_delete(local_1488[0]);
  }
  local_1058._0_8_ = &PTR__typed_option_002cf5a0;
  if (local_fc0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fc0._M_pi);
  }
  if (local_fd0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fd0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1058);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e58._M_dataplus._M_p != &local_e58.field_2) {
    operator_delete(local_e58._M_dataplus._M_p);
  }
  local_a30.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf5a0;
  if (local_a30.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a30.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_a30.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a30.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_a30.super_base_option);
  if (local_1468[0] != local_1458) {
    operator_delete(local_1468[0]);
  }
  local_fb8._0_8_ = &PTR__typed_option_002cf5a0;
  if (local_f20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f20._M_pi);
  }
  if (local_f30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f30._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_fb8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
    operator_delete(local_e38._M_dataplus._M_p);
  }
  local_990.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf5a0;
  if (local_990.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_990.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_990.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_990.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_990.super_base_option);
  if (local_14a8[0] != local_1498) {
    operator_delete(local_14a8[0]);
  }
  local_12a8._0_8_ = &PTR__typed_option_002cf5a0;
  if (local_1210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1210._M_pi);
  }
  if (local_1220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1220._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_12a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13c8._M_dataplus._M_p != &local_13c8.field_2) {
    operator_delete(local_13c8._M_dataplus._M_p);
  }
  local_8f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf568;
  if (local_8f0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_8f0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_8f0.super_base_option);
  if ((undefined1 *)local_1168._0_8_ != local_1168 + 0x10) {
    operator_delete((void *)local_1168._0_8_);
  }
  local_c78._0_8_ = &PTR__typed_option_002cf568;
  if (local_be0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_be0._M_pi);
  }
  if (local_bf0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_bf0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_c78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13a8._M_dataplus._M_p != &local_13a8.field_2) {
    operator_delete(local_13a8._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,local_d78);
  local_c78._0_8_ = local_c78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c78,"total","");
  iVar6 = (*options->_vptr_options_i[1])(options,local_c78);
  if ((byte)iVar6 == 0) {
    local_12a8._0_8_ = local_12a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_12a8,"node","");
    iVar7 = (*options->_vptr_options_i[1])(options,local_12a8);
    if ((char)iVar7 != '\0') goto LAB_00130c1b;
    local_fb8._0_8_ = local_fb8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_fb8,"unique_id","");
    iVar7 = (*options->_vptr_options_i[1])(options,local_fb8);
    bVar4 = true;
    bVar2 = true;
    if ((char)iVar7 == '\0') {
      bVar3 = false;
      bVar10 = 1;
      cVar5 = '\0';
      bVar2 = false;
      bVar11 = 0;
      goto LAB_00130cdc;
    }
  }
  else {
LAB_00130c1b:
    bVar2 = false;
  }
  bVar4 = bVar2;
  bVar10 = (byte)iVar6 ^ 1;
  local_1058._0_8_ = local_1058 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1058,"total","");
  iVar6 = (*options->_vptr_options_i[1])(options,local_1058);
  cVar5 = (char)iVar6;
  if (cVar5 == '\0') {
LAB_00130cd1:
    bVar2 = false;
    bVar11 = 0;
  }
  else {
    local_1168._0_8_ = local_1168 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1168,"node","");
    iVar6 = (*options->_vptr_options_i[1])(options,local_1168);
    if ((char)iVar6 == '\0') goto LAB_00130cd1;
    local_14a8[0] = local_1498;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14a8,"unique_id","");
    iVar6 = (*options->_vptr_options_i[1])(options,local_14a8);
    bVar11 = (byte)iVar6;
    bVar2 = true;
  }
  bVar11 = bVar11 ^ 1;
  bVar3 = true;
LAB_00130cdc:
  if ((bVar2) && (local_14a8[0] != local_1498)) {
    operator_delete(local_14a8[0]);
  }
  pp_Var1 = (_func_int **)(local_c78 + 0x10);
  if ((cVar5 != '\0') && ((undefined1 *)local_1168._0_8_ != local_1168 + 0x10)) {
    operator_delete((void *)local_1168._0_8_);
  }
  if ((bVar3) && ((undefined1 *)local_1058._0_8_ != local_1058 + 0x10)) {
    operator_delete((void *)local_1058._0_8_);
  }
  if ((bVar4) && ((undefined1 *)local_fb8._0_8_ != local_fb8 + 0x10)) {
    operator_delete((void *)local_fb8._0_8_);
  }
  if ((bVar10 != 0) && ((undefined1 *)local_12a8._0_8_ != local_12a8 + 0x10)) {
    operator_delete((void *)local_12a8._0_8_);
  }
  if ((_func_int **)local_c78._0_8_ != pp_Var1) {
    operator_delete((void *)local_c78._0_8_);
  }
  if (bVar11 == 0) {
    local_c78._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c78,"span_server","");
    iVar6 = (*options->_vptr_options_i[1])(options,local_c78);
    if ((_func_int **)local_c78._0_8_ != pp_Var1) {
      operator_delete((void *)local_c78._0_8_);
    }
    if ((char)iVar6 != '\0') {
      this->all_reduce_type = Socket;
      this_01 = (AllReduceSockets *)operator_new(0x70);
      local_e78._M_dataplus._M_p = (pointer)&local_e78.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e78,local_f18._0_8_,(pointer)(local_f18._8_8_ + local_f18._0_8_));
      AllReduceSockets::AllReduceSockets
                (this_01,&local_e78,(size_t)local_13f0[0],(size_t)local_1410[0],
                 (size_t)local_1368[0]);
      this->all_reduce = (AllReduce *)this_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e78._M_dataplus._M_p != &local_e78.field_2) {
        operator_delete(local_e78._M_dataplus._M_p);
      }
    }
    parse_diagnostics(options,this);
    this->initial_t = (float)this->sd->t;
    std::
    vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
    ::~vector((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
               *)(local_d78 + 0x20));
    if ((undefined1 *)local_d78._0_8_ != local_d78 + 0x10) {
      operator_delete((void *)local_d78._0_8_);
    }
    if ((undefined1 *)local_f18._0_8_ != local_f18 + 0x10) {
      operator_delete((void *)local_f18._0_8_);
    }
    std::
    vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
    ::~vector(&local_1448.m_options);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1448.m_name._M_dataplus._M_p != &local_1448.m_name.field_2) {
      operator_delete(local_1448.m_name._M_dataplus._M_p);
    }
    std::
    vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
    ::~vector(&local_10c8.m_options);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_10c8.m_name._M_dataplus._M_p != &local_10c8.m_name.field_2) {
      operator_delete(local_10c8.m_name._M_dataplus._M_p);
    }
    std::
    vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
    ::~vector(&local_1090.m_options);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1090.m_name._M_dataplus._M_p != &local_1090.m_name.field_2) {
      operator_delete(local_1090.m_name._M_dataplus._M_p);
    }
    return this;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_c78);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_c78 + 0x10),
             "you must specificy unique_id, total, and node if you specify any",0x40);
  this_02 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_02,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
             ,0x544,&local_af0);
  __cxa_throw(this_02,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

vw& parse_args(options_i& options, trace_message_t trace_listener, void* trace_context)
{
  vw& all = *(new vw());
  all.options = &options;

  if (trace_listener)
  {
    all.trace_message.trace_listener = trace_listener;
    all.trace_message.trace_context = trace_context;
  }

  try
  {
    time(&all.init_time);

    size_t ring_size;
    option_group_definition vw_args("VW options");
    vw_args.add(make_option("ring_size", ring_size).default_value(256).help("size of example ring"));
    options.add_and_parse(vw_args);

    all.p = new parser{ring_size};

    option_group_definition update_args("Update options");
    update_args.add(make_option("learning_rate", all.eta).help("Set learning rate").short_name("l"))
        .add(make_option("power_t", all.power_t).help("t power value"))
        .add(make_option("decay_learning_rate", all.eta_decay_rate)
                 .help("Set Decay factor for learning_rate between passes"))
        .add(make_option("initial_t", all.sd->t).help("initial t value"))
        .add(make_option("feature_mask", all.feature_mask)
                 .help("Use existing regressor to determine which parameters may be updated.  If no initial_regressor "
                       "given, also used for initial weights."));
    options.add_and_parse(update_args);

    option_group_definition weight_args("Weight options");
    weight_args
        .add(make_option("initial_regressor", all.initial_regressors).help("Initial regressor(s)").short_name("i"))
        .add(make_option("initial_weight", all.initial_weight).help("Set all weights to an initial value of arg."))
        .add(make_option("random_weights", all.random_weights).help("make initial weights random"))
        .add(make_option("normal_weights", all.normal_weights).help("make initial weights normal"))
        .add(make_option("truncated_normal_weights", all.tnormal_weights).help("make initial weights truncated normal"))
        .add(make_option("sparse_weights", all.weights.sparse).help("Use a sparse datastructure for weights"))
        .add(make_option("input_feature_regularizer", all.per_feature_regularizer_input)
                 .help("Per feature regularization input file"));
    options.add_and_parse(weight_args);

    std::string span_server_arg;
    // bool threads_arg;
    size_t unique_id_arg;
    size_t total_arg;
    size_t node_arg;
    option_group_definition parallelization_args("Parallelization options");
    parallelization_args
        .add(make_option("span_server", span_server_arg).help("Location of server for setting up spanning tree"))
        //(make_option("threads", threads_arg).help("Enable multi-threading")) Unused option?
        .add(make_option("unique_id", unique_id_arg).default_value(0).help("unique id used for cluster parallel jobs"))
        .add(
            make_option("total", total_arg).default_value(1).help("total number of nodes used in cluster parallel job"))
        .add(make_option("node", node_arg).default_value(0).help("node number in cluster parallel job"));
    options.add_and_parse(parallelization_args);

    // total, unique_id and node must be specified together.
    if ((options.was_supplied("total") || options.was_supplied("node") || options.was_supplied("unique_id")) &&
        !(options.was_supplied("total") && options.was_supplied("node") && options.was_supplied("unique_id")))
    {
      THROW("you must specificy unique_id, total, and node if you specify any");
    }

    if (options.was_supplied("span_server"))
    {
      all.all_reduce_type = AllReduceType::Socket;
      all.all_reduce = new AllReduceSockets(span_server_arg, unique_id_arg, total_arg, node_arg);
    }

    parse_diagnostics(options, all);

    all.initial_t = (float)all.sd->t;
    return all;
  }
  catch (...)
  {
    VW::finish(all);
    throw;
  }
}